

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

bool __thiscall QMakeEvaluator::loadSpecInternal(QMakeEvaluator *this)

{
  VisitReturn VVar1;
  VisitReturn VVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QString spec;
  undefined4 in_stack_fffffffffffffe48;
  LoadFlag in_stack_fffffffffffffe4c;
  QMakeEvaluator *this_00;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  QString *a;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  byte bVar4;
  QMakeEvaluator *in_stack_fffffffffffffe78;
  QLatin1StringView in_stack_fffffffffffffe80;
  EvalFileType in_stack_fffffffffffffe94;
  undefined6 in_stack_fffffffffffffe98;
  QChar in_stack_fffffffffffffe9e;
  QMakeEvaluator *in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffecf;
  QString *in_stack_fffffffffffffed0;
  QMakeEvaluator *in_stack_fffffffffffffed8;
  QFlagsStorage<QMakeEvaluator::LoadFlag> in_stack_ffffffffffffff3c;
  QChar local_ba;
  storage_type *local_b8;
  undefined1 local_a8 [96];
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  a = in_RDI;
  QLatin1String::QLatin1String
            ((QLatin1String *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             (char *)in_RDI);
  QString::QString((QString *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   in_stack_fffffffffffffe80);
  VVar1 = evaluateFeatureFile(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                              (bool)in_stack_fffffffffffffecf);
  QString::~QString((QString *)0x2f8d41);
  if (VVar1 == ReturnTrue) {
    local_48 = 0xaaaaaaaaaaaaaaaa;
    local_40 = 0xaaaaaaaaaaaaaaaa;
    local_38 = 0xaaaaaaaaaaaaaaaa;
    this_00 = (QMakeEvaluator *)((long)(in_RDI + 6) + 8);
    QLatin1String::QLatin1String
              ((QLatin1String *)CONCAT44(in_stack_fffffffffffffe64,1),(char *)in_RDI);
    ::operator+((QString *)this_00,
                (QLatin1String *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QString_&,_QLatin1String> *)
               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    QFlags<QMakeEvaluator::LoadFlag>::QFlags
              ((QFlags<QMakeEvaluator::LoadFlag> *)this_00,in_stack_fffffffffffffe4c);
    VVar2 = evaluateFile(in_stack_fffffffffffffea0,
                         (QString *)
                         CONCAT26(in_stack_fffffffffffffe9e.ucs,in_stack_fffffffffffffe98),
                         in_stack_fffffffffffffe94,(LoadFlags)in_stack_ffffffffffffff3c.i);
    if (VVar2 == ReturnTrue) {
      ProString::ProString
                ((ProString *)this_00,
                 (QString *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      ProStringList::ProStringList
                ((ProStringList *)this_00,
                 (ProString *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      ProKey::ProKey((ProKey *)this_00,
                     (char *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      valuesRef(in_stack_fffffffffffffe78,
                (ProKey *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
      ProStringList::operator=
                ((ProStringList *)this_00,
                 (ProStringList *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      ProKey::~ProKey((ProKey *)0x2f8f24);
      ProStringList::~ProStringList((ProStringList *)0x2f8f31);
      ProString::~ProString((ProString *)0x2f8f3e);
      QMakeInternal::IoUtils::fileName((QString *)CONCAT44(in_stack_fffffffffffffe64,VVar1));
      QStringView::toString((QStringView *)this_00);
      QString::operator=((QString *)this_00,
                         (QString *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      QString::~QString((QString *)0x2f8f88);
      QLatin1String::QLatin1String
                ((QLatin1String *)CONCAT44(in_stack_fffffffffffffe64,VVar1),(char *)in_RDI);
      QString::QString((QString *)CONCAT44(in_stack_fffffffffffffe64,VVar1),
                       in_stack_fffffffffffffe80);
      VVar1 = evaluateFeatureFile(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                                  (bool)in_stack_fffffffffffffecf);
      QString::~QString((QString *)0x2f8fcc);
      if (VVar1 == ReturnTrue) {
        bVar4 = 1;
      }
      else {
        bVar4 = 0;
      }
    }
    else {
      QByteArrayView::QByteArrayView<44ul>
                ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffe64,VVar1),(char (*) [44])in_RDI);
      QVar3.m_data = local_b8;
      QVar3.m_size = (qsizetype)local_a8;
      QString::fromLatin1(QVar3);
      QChar::QChar<char16_t,_true>(&local_ba,L' ');
      QString::arg<QString,_true>
                ((QString *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),a,
                 in_stack_fffffffffffffe64,in_stack_fffffffffffffe9e);
      evalError(this_00,(QString *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      QString::~QString((QString *)0x2f8e94);
      QString::~QString((QString *)0x2f8ea1);
      bVar4 = 0;
    }
    QString::~QString((QString *)0x2f8ffe);
  }
  else {
    bVar4 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar4 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QMakeEvaluator::loadSpecInternal()
{
    if (evaluateFeatureFile(QLatin1String("spec_pre.prf")) != ReturnTrue)
        return false;
    QString spec = m_qmakespec + QLatin1String("/qmake.conf");
    if (evaluateFile(spec, QMakeHandler::EvalConfigFile, LoadProOnly) != ReturnTrue) {
        evalError(fL1S("Could not read qmake configuration file %1.").arg(spec));
        return false;
    }
#ifndef QT_BUILD_QMAKE
    // Legacy support for Qt4 default specs
#  ifdef Q_OS_UNIX
    if (m_qmakespec.endsWith(QLatin1String("/default-host"))
        || m_qmakespec.endsWith(QLatin1String("/default"))) {
        QString rspec = QFileInfo(m_qmakespec).symLinkTarget();
        if (!rspec.isEmpty())
            m_qmakespec = QDir::cleanPath(QDir(m_qmakespec).absoluteFilePath(rspec));
    }
#  else
    // We can't resolve symlinks as they do on Unix, so configure.exe puts
    // the source of the qmake.conf at the end of the default/qmake.conf in
    // the QMAKESPEC_ORIGINAL variable.
    const ProString &orig_spec = first(ProKey("QMAKESPEC_ORIGINAL"));
    if (!orig_spec.isEmpty()) {
        QString spec = orig_spec.toQString();
        if (IoUtils::isAbsolutePath(spec))
            m_qmakespec = spec;
    }
#  endif
#endif
    valuesRef(ProKey("QMAKESPEC")) = ProString(m_qmakespec);
    m_qmakespecName = IoUtils::fileName(m_qmakespec).toString();
    // This also ensures that m_featureRoots is valid.
    if (evaluateFeatureFile(QLatin1String("spec_post.prf")) != ReturnTrue)
        return false;
    return true;
}